

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

any __thiscall
cs_impl::any::make<std::pair<cs_impl::any,cs_impl::any>,cs_impl::any,cs_impl::any>
          (any *this,any *args,any *args_1)

{
  proxy *ppVar1;
  int local_1c;
  holder<std::pair<cs_impl::any,_cs_impl::any>_> *local_18;
  
  local_1c = 1;
  local_18 = cs::
             allocator_type<cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>,64ul,cs_impl::default_allocator_provider>
             ::alloc<cs_impl::any,cs_impl::any>
                       ((allocator_type<cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>,64ul,cs_impl::default_allocator_provider>
                         *)holder<std::pair<cs_impl::any,cs_impl::any>>::allocator,args,args_1);
  ppVar1 = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
           alloc<int,cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>*>
                     ((allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>
                       *)allocator,&local_1c,&local_18);
  this->mDat = ppVar1;
  return (any)(proxy *)this;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}